

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf_avx2.c
# Opt level: O1

void uavs3d_alf_one_lcu_one_chroma_avx2
               (pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
               int sample_bit_depth)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined2 uVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  long lVar26;
  undefined1 (*pauVar27) [32];
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [32];
  undefined1 (*pauVar31) [32];
  undefined1 (*pauVar32) [32];
  undefined1 (*pauVar33) [32];
  uint uVar34;
  ushort uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  
  if (0 < lcu_height) {
    uVar35 = ~(ushort)(-1 << ((byte)sample_bit_depth & 0x1f));
    auVar48._2_2_ = uVar35;
    auVar48._0_2_ = uVar35;
    auVar48._4_2_ = uVar35;
    auVar48._6_2_ = uVar35;
    auVar48._8_2_ = uVar35;
    auVar48._10_2_ = uVar35;
    auVar48._12_2_ = uVar35;
    auVar48._14_2_ = uVar35;
    auVar48._16_2_ = uVar35;
    auVar48._18_2_ = uVar35;
    auVar48._20_2_ = uVar35;
    auVar48._22_2_ = uVar35;
    auVar48._24_2_ = uVar35;
    auVar48._26_2_ = uVar35;
    auVar48._28_2_ = uVar35;
    auVar48._30_2_ = uVar35;
    uVar4 = (undefined2)*coef;
    auVar38._2_2_ = uVar4;
    auVar38._0_2_ = uVar4;
    auVar38._4_2_ = uVar4;
    auVar38._6_2_ = uVar4;
    auVar38._8_2_ = uVar4;
    auVar38._10_2_ = uVar4;
    auVar38._12_2_ = uVar4;
    auVar38._14_2_ = uVar4;
    auVar38._16_2_ = uVar4;
    auVar38._18_2_ = uVar4;
    auVar38._20_2_ = uVar4;
    auVar38._22_2_ = uVar4;
    auVar38._24_2_ = uVar4;
    auVar38._26_2_ = uVar4;
    auVar38._28_2_ = uVar4;
    auVar38._30_2_ = uVar4;
    uVar4 = (undefined2)coef[2];
    auVar40._2_2_ = uVar4;
    auVar40._0_2_ = uVar4;
    auVar40._4_2_ = uVar4;
    auVar40._6_2_ = uVar4;
    auVar40._8_2_ = uVar4;
    auVar40._10_2_ = uVar4;
    auVar40._12_2_ = uVar4;
    auVar40._14_2_ = uVar4;
    auVar40._16_2_ = uVar4;
    auVar40._18_2_ = uVar4;
    auVar40._20_2_ = uVar4;
    auVar40._22_2_ = uVar4;
    auVar40._24_2_ = uVar4;
    auVar40._26_2_ = uVar4;
    auVar40._28_2_ = uVar4;
    auVar40._30_2_ = uVar4;
    uVar4 = (undefined2)coef[4];
    auVar41._2_2_ = uVar4;
    auVar41._0_2_ = uVar4;
    auVar41._4_2_ = uVar4;
    auVar41._6_2_ = uVar4;
    auVar41._8_2_ = uVar4;
    auVar41._10_2_ = uVar4;
    auVar41._12_2_ = uVar4;
    auVar41._14_2_ = uVar4;
    auVar41._16_2_ = uVar4;
    auVar41._18_2_ = uVar4;
    auVar41._20_2_ = uVar4;
    auVar41._22_2_ = uVar4;
    auVar41._24_2_ = uVar4;
    auVar41._26_2_ = uVar4;
    auVar41._28_2_ = uVar4;
    auVar41._30_2_ = uVar4;
    uVar4 = (undefined2)coef[6];
    auVar42._2_2_ = uVar4;
    auVar42._0_2_ = uVar4;
    auVar42._4_2_ = uVar4;
    auVar42._6_2_ = uVar4;
    auVar42._8_2_ = uVar4;
    auVar42._10_2_ = uVar4;
    auVar42._12_2_ = uVar4;
    auVar42._14_2_ = uVar4;
    auVar42._16_2_ = uVar4;
    auVar42._18_2_ = uVar4;
    auVar42._20_2_ = uVar4;
    auVar42._22_2_ = uVar4;
    auVar42._24_2_ = uVar4;
    auVar42._26_2_ = uVar4;
    auVar42._28_2_ = uVar4;
    auVar42._30_2_ = uVar4;
    uVar4 = (undefined2)coef[8];
    auVar43._2_2_ = uVar4;
    auVar43._0_2_ = uVar4;
    auVar43._4_2_ = uVar4;
    auVar43._6_2_ = uVar4;
    auVar43._8_2_ = uVar4;
    auVar43._10_2_ = uVar4;
    auVar43._12_2_ = uVar4;
    auVar43._14_2_ = uVar4;
    auVar43._16_2_ = uVar4;
    auVar43._18_2_ = uVar4;
    auVar43._20_2_ = uVar4;
    auVar43._22_2_ = uVar4;
    auVar43._24_2_ = uVar4;
    auVar43._26_2_ = uVar4;
    auVar43._28_2_ = uVar4;
    auVar43._30_2_ = uVar4;
    uVar4 = (undefined2)coef[10];
    auVar45._2_2_ = uVar4;
    auVar45._0_2_ = uVar4;
    auVar45._4_2_ = uVar4;
    auVar45._6_2_ = uVar4;
    auVar45._8_2_ = uVar4;
    auVar45._10_2_ = uVar4;
    auVar45._12_2_ = uVar4;
    auVar45._14_2_ = uVar4;
    auVar45._16_2_ = uVar4;
    auVar45._18_2_ = uVar4;
    auVar45._20_2_ = uVar4;
    auVar45._22_2_ = uVar4;
    auVar45._24_2_ = uVar4;
    auVar45._26_2_ = uVar4;
    auVar45._28_2_ = uVar4;
    auVar45._30_2_ = uVar4;
    uVar4 = (undefined2)coef[0xc];
    auVar46._2_2_ = uVar4;
    auVar46._0_2_ = uVar4;
    auVar46._4_2_ = uVar4;
    auVar46._6_2_ = uVar4;
    auVar46._8_2_ = uVar4;
    auVar46._10_2_ = uVar4;
    auVar46._12_2_ = uVar4;
    auVar46._14_2_ = uVar4;
    auVar46._16_2_ = uVar4;
    auVar46._18_2_ = uVar4;
    auVar46._20_2_ = uVar4;
    auVar46._22_2_ = uVar4;
    auVar46._24_2_ = uVar4;
    auVar46._26_2_ = uVar4;
    auVar46._28_2_ = uVar4;
    auVar46._30_2_ = uVar4;
    uVar4 = (undefined2)coef[0xe];
    auVar47._2_2_ = uVar4;
    auVar47._0_2_ = uVar4;
    auVar47._4_2_ = uVar4;
    auVar47._6_2_ = uVar4;
    auVar47._8_2_ = uVar4;
    auVar47._10_2_ = uVar4;
    auVar47._12_2_ = uVar4;
    auVar47._14_2_ = uVar4;
    auVar47._16_2_ = uVar4;
    auVar47._18_2_ = uVar4;
    auVar47._20_2_ = uVar4;
    auVar47._22_2_ = uVar4;
    auVar47._24_2_ = uVar4;
    auVar47._26_2_ = uVar4;
    auVar47._28_2_ = uVar4;
    auVar47._30_2_ = uVar4;
    iVar5 = coef[0x10];
    auVar49._4_4_ = iVar5;
    auVar49._0_4_ = iVar5;
    auVar49._8_4_ = iVar5;
    auVar49._12_4_ = iVar5;
    auVar49._16_4_ = iVar5;
    auVar49._20_4_ = iVar5;
    auVar49._24_4_ = iVar5;
    auVar49._28_4_ = iVar5;
    uVar34 = 0;
    auVar44._8_2_ = 0xff;
    auVar44._0_8_ = 0xff00ff00ff00ff;
    auVar44._10_2_ = 0xff;
    auVar44._12_2_ = 0xff;
    auVar44._14_2_ = 0xff;
    auVar44._16_2_ = 0xff;
    auVar44._18_2_ = 0xff;
    auVar44._20_2_ = 0xff;
    auVar44._22_2_ = 0xff;
    auVar44._24_2_ = 0xff;
    auVar44._26_2_ = 0xff;
    auVar44._28_2_ = 0xff;
    auVar44._30_2_ = 0xff;
    do {
      pauVar27 = (undefined1 (*) [32])(*(undefined1 (*) [32])src + i_src);
      pauVar1 = (undefined1 (*) [32])((long)src - (long)i_src);
      pauVar2 = (undefined1 (*) [32])(*(undefined1 (*) [32])src + i_src * 2);
      pauVar3 = (undefined1 (*) [32])((long)src - (long)(i_src * 2));
      pauVar33 = (undefined1 (*) [32])(*(undefined1 (*) [32])src + i_src * 3);
      pauVar28 = pauVar27;
      pauVar30 = pauVar2;
      pauVar31 = pauVar3;
      pauVar32 = pauVar1;
      if (uVar34 < 3) {
        pauVar29 = (undefined1 (*) [32])src;
        pauVar31 = (undefined1 (*) [32])src;
        pauVar32 = (undefined1 (*) [32])src;
        if ((uVar34 != 0) &&
           (pauVar29 = pauVar3, pauVar31 = pauVar3, pauVar32 = pauVar1, uVar34 == 1)) {
          pauVar29 = pauVar1;
          pauVar31 = pauVar1;
        }
      }
      else {
        pauVar29 = (undefined1 (*) [32])((long)src - (long)(i_src * 3));
        if (((lcu_height + -4 < (int)uVar34) &&
            (pauVar28 = (undefined1 (*) [32])src, pauVar30 = (undefined1 (*) [32])src,
            pauVar33 = (undefined1 (*) [32])src, uVar34 != lcu_height - 1U)) &&
           (pauVar28 = pauVar27, pauVar30 = pauVar2, pauVar33 = pauVar2, uVar34 == lcu_height - 2U))
        {
          pauVar30 = pauVar27;
          pauVar33 = pauVar27;
        }
      }
      if (lcu_width < 0x11) {
        auVar36 = vpand_avx2(auVar44,*pauVar29);
        auVar39 = vpand_avx2(auVar44,*pauVar33);
        auVar36 = vpaddw_avx2(auVar39,auVar36);
        auVar39 = vpand_avx2(auVar44,*pauVar31);
        auVar13 = vpmullw_avx2(auVar36,auVar38);
        auVar36 = vpand_avx2(auVar44,*pauVar30);
        auVar36 = vpaddw_avx2(auVar36,auVar39);
        auVar39 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar32[-1] + 0x1e));
        auVar37 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar28 + 2));
        auVar14 = vpmullw_avx2(auVar36,auVar40);
        auVar36 = vpaddw_avx2(auVar37,auVar39);
        auVar39 = vpand_avx2(auVar44,*pauVar32);
        auVar37 = vpand_avx2(auVar44,*pauVar28);
        auVar6 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar32 + 2));
        auVar39 = vpaddw_avx2(auVar37,auVar39);
        auVar37 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar28[-1] + 0x1e));
        auVar37 = vpaddw_avx2(auVar37,auVar6);
        auVar15 = vpmullw_avx2(auVar36,auVar41);
        auVar16 = vpmullw_avx2(auVar39,auVar42);
        auVar6 = vpand_avx2(auVar44,*(undefined1 (*) [32])src);
        auVar36 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])((long)src + -0x20) + 0x1a));
        auVar39 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + 6));
        auVar17 = vpmullw_avx2(auVar43,auVar37);
        auVar36 = vpaddw_avx2(auVar39,auVar36);
        auVar39 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                      (*(undefined1 (*) [32])((long)src + -0x20) + 0x1c));
        auVar37 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + 4));
        auVar7 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                     (*(undefined1 (*) [32])((long)src + -0x20) + 0x1e));
        auVar39 = vpaddw_avx2(auVar37,auVar39);
        auVar37 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + 2));
        auVar37 = vpaddw_avx2(auVar37,auVar7);
        auVar18 = vpmullw_avx2(auVar45,auVar36);
        auVar19 = vpmullw_avx2(auVar46,auVar39);
        auVar20 = vpmullw_avx2(auVar37,auVar47);
        auVar36 = vpmovzxwd_avx2(auVar6._0_16_);
        auVar37 = vpmullw_avx2(auVar36,auVar49);
        auVar36 = vpmovsxwd_avx2(auVar13._0_16_);
        auVar39 = vpmovsxwd_avx2(auVar14._0_16_);
        auVar36 = vpaddd_avx2(auVar36,auVar39);
        auVar39 = vpmovsxwd_avx2(auVar15._0_16_);
        auVar39 = vpaddd_avx2(auVar39,auVar37);
        auVar37 = vpmovsxwd_avx2(auVar16._0_16_);
        auVar7 = vpmovsxwd_avx2(auVar17._0_16_);
        auVar37 = vpaddd_avx2(auVar7,auVar37);
        auVar36 = vpaddd_avx2(auVar36,auVar37);
        auVar37 = vpmovsxwd_avx2(auVar18._0_16_);
        auVar7 = vpmovsxwd_avx2(auVar19._0_16_);
        auVar37 = vpaddd_avx2(auVar7,auVar37);
        auVar7 = vpmovsxwd_avx2(auVar20._0_16_);
        auVar39 = vpaddd_avx2(auVar39,auVar7);
        auVar36 = vpaddd_avx2(auVar36,auVar39);
        auVar39 = vpmovsxwd_avx2(auVar13._16_16_);
        auVar7 = vpmovsxwd_avx2(auVar14._16_16_);
        auVar39 = vpaddd_avx2(auVar39,auVar7);
        auVar6 = vpmovzxwd_avx2(auVar6._16_16_);
        auVar7 = vpmullw_avx2(auVar49,auVar6);
        auVar6 = vpmovsxwd_avx2(auVar15._16_16_);
        auVar6 = vpaddd_avx2(auVar6,auVar7);
        auVar7 = vpmovsxwd_avx2(auVar16._16_16_);
        auVar13 = vpmovsxwd_avx2(auVar17._16_16_);
        auVar7 = vpaddd_avx2(auVar13,auVar7);
        auVar39 = vpaddd_avx2(auVar39,auVar7);
        auVar14._8_4_ = 0x20;
        auVar14._0_8_ = 0x2000000020;
        auVar14._12_4_ = 0x20;
        auVar14._16_4_ = 0x20;
        auVar14._20_4_ = 0x20;
        auVar14._24_4_ = 0x20;
        auVar14._28_4_ = 0x20;
        auVar7 = vpmovsxwd_avx2(auVar18._16_16_);
        auVar13 = vpmovsxwd_avx2(auVar19._16_16_);
        auVar7 = vpaddd_avx2(auVar13,auVar7);
        auVar13 = vpmovsxwd_avx2(auVar20._16_16_);
        auVar6 = vpaddd_avx2(auVar6,auVar13);
        auVar39 = vpaddd_avx2(auVar39,auVar6);
        auVar37 = vpaddd_avx2(auVar37,auVar14);
        auVar36 = vpaddd_avx2(auVar36,auVar37);
        auVar37 = vpaddd_avx2(auVar7,auVar14);
        auVar39 = vpaddd_avx2(auVar39,auVar37);
        auVar37 = vpsrad_avx2(auVar36,6);
        auVar36 = vpsrad_avx2(auVar39,6);
        auVar36 = vpackssdw_avx2(auVar37,auVar36);
        auVar36 = vpermq_avx2(auVar36,0xd8);
        auVar36 = vpminsw_avx2(auVar48,auVar36);
        auVar36 = vpmaxsw_avx2(auVar36,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        auVar39._8_2_ = 0xff00;
        auVar39._0_8_ = 0xff00ff00ff00ff00;
        auVar39._10_2_ = 0xff00;
        auVar39._12_2_ = 0xff00;
        auVar39._14_2_ = 0xff00;
        auVar39._16_2_ = 0xff00;
        auVar39._18_2_ = 0xff00;
        auVar39._20_2_ = 0xff00;
        auVar39._22_2_ = 0xff00;
        auVar39._24_2_ = 0xff00;
        auVar39._26_2_ = 0xff00;
        auVar39._28_2_ = 0xff00;
        auVar39._30_2_ = 0xff00;
        auVar36 = vpblendvb_avx2(auVar36,*(undefined1 (*) [32])dst,auVar39);
        *(undefined1 (*) [32])dst = auVar36;
      }
      else if (0 < lcu_width * 2) {
        lVar26 = 0;
        do {
          auVar36 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar29 + lVar26));
          auVar39 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar33 + lVar26));
          auVar37 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar29[1] + lVar26));
          auVar36 = vpaddw_avx2(auVar39,auVar36);
          auVar39 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar33[1] + lVar26));
          auVar39 = vpaddw_avx2(auVar39,auVar37);
          auVar37 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar31 + lVar26));
          auVar6 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar30 + lVar26));
          auVar7 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar31[1] + lVar26));
          auVar13 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar30[1] + lVar26));
          auVar37 = vpaddw_avx2(auVar6,auVar37);
          auVar6 = vpaddw_avx2(auVar13,auVar7);
          auVar7 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar32[-1] + lVar26 + 0x1e));
          auVar13 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar28 + lVar26 + 2));
          auVar14 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar32 + lVar26 + 0x1e));
          auVar7 = vpaddw_avx2(auVar13,auVar7);
          auVar13 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar28[1] + lVar26 + 2));
          auVar13 = vpaddw_avx2(auVar13,auVar14);
          auVar14 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar32 + lVar26));
          auVar15 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar28 + lVar26));
          auVar16 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar32[1] + lVar26));
          auVar17 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar28[1] + lVar26));
          auVar14 = vpaddw_avx2(auVar15,auVar14);
          auVar15 = vpaddw_avx2(auVar17,auVar16);
          auVar16 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar32 + lVar26 + 2));
          auVar17 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar28[-1] + lVar26 + 0x1e));
          auVar18 = vpand_avx2(auVar44,*(undefined1 (*) [32])(pauVar32[1] + lVar26 + 2));
          auVar16 = vpaddw_avx2(auVar17,auVar16);
          auVar17 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*pauVar28 + lVar26 + 0x1e));
          auVar17 = vpaddw_avx2(auVar17,auVar18);
          auVar18 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                        (*(undefined1 (*) [32])((long)src + -0x20) + lVar26 + 0x1a))
          ;
          auVar19 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                        (*(undefined1 (*) [32])src + lVar26 + 6));
          auVar20 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                        (*(undefined1 (*) [32])src + lVar26 + 0x1a));
          auVar8 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                       (*(undefined1 (*) [32])((long)src + 0x20) + lVar26 + 6));
          auVar18 = vpaddw_avx2(auVar19,auVar18);
          auVar19 = vpaddw_avx2(auVar8,auVar20);
          auVar20 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                        (*(undefined1 (*) [32])((long)src + -0x20) + lVar26 + 0x1c))
          ;
          auVar8 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + lVar26 + 4)
                             );
          auVar9 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                       (*(undefined1 (*) [32])src + lVar26 + 0x1c));
          auVar20 = vpaddw_avx2(auVar8,auVar20);
          auVar8 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                       (*(undefined1 (*) [32])((long)src + 0x20) + lVar26 + 4));
          auVar8 = vpaddw_avx2(auVar8,auVar9);
          auVar9 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                       (*(undefined1 (*) [32])((long)src + -0x20) + lVar26 + 0x1e));
          auVar10 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                        (*(undefined1 (*) [32])src + lVar26 + 2));
          auVar11 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                        (*(undefined1 (*) [32])src + lVar26 + 0x1e));
          auVar12 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                        (*(undefined1 (*) [32])((long)src + 0x20) + lVar26 + 2));
          auVar9 = vpaddw_avx2(auVar10,auVar9);
          auVar10 = vpaddw_avx2(auVar12,auVar11);
          auVar12 = vpmullw_avx2(auVar36,auVar38);
          auVar21 = vpmullw_avx2(auVar37,auVar40);
          auVar36 = vpmovsxwd_avx2(auVar12._0_16_);
          auVar37 = vpmovsxwd_avx2(auVar21._0_16_);
          auVar36 = vpaddd_avx2(auVar37,auVar36);
          auVar22 = vpmullw_avx2(auVar7,auVar41);
          auVar11 = vpand_avx2(auVar44,*(undefined1 (*) [32])(*(undefined1 (*) [32])src + lVar26));
          auVar37 = vpmovzxwd_avx2(auVar11._0_16_);
          auVar7 = vpmullw_avx2(auVar37,auVar49);
          auVar37 = vpmovsxwd_avx2(auVar22._0_16_);
          auVar37 = vpaddd_avx2(auVar37,auVar7);
          auVar23 = vpmullw_avx2(auVar14,auVar42);
          auVar24 = vpmullw_avx2(auVar43,auVar16);
          auVar7 = vpmovsxwd_avx2(auVar23._0_16_);
          auVar14 = vpmovsxwd_avx2(auVar24._0_16_);
          auVar7 = vpaddd_avx2(auVar14,auVar7);
          auVar36 = vpaddd_avx2(auVar36,auVar7);
          auVar25 = vpmullw_avx2(auVar18,auVar45);
          auVar20 = vpmullw_avx2(auVar20,auVar46);
          auVar7 = vpmovsxwd_avx2(auVar25._0_16_);
          auVar14 = vpmovsxwd_avx2(auVar20._0_16_);
          auVar7 = vpaddd_avx2(auVar14,auVar7);
          auVar9 = vpmullw_avx2(auVar9,auVar47);
          auVar14 = vpmovsxwd_avx2(auVar9._0_16_);
          auVar37 = vpaddd_avx2(auVar37,auVar14);
          auVar36 = vpaddd_avx2(auVar36,auVar37);
          auVar37 = vpmovsxwd_avx2(auVar12._16_16_);
          auVar14 = vpmovsxwd_avx2(auVar21._16_16_);
          auVar37 = vpaddd_avx2(auVar37,auVar14);
          auVar14 = vpmovzxwd_avx2(auVar11._16_16_);
          auVar16 = vpmullw_avx2(auVar14,auVar49);
          auVar14 = vpmovsxwd_avx2(auVar22._16_16_);
          auVar14 = vpaddd_avx2(auVar14,auVar16);
          auVar16 = vpmovsxwd_avx2(auVar23._16_16_);
          auVar18 = vpmovsxwd_avx2(auVar24._16_16_);
          auVar16 = vpaddd_avx2(auVar18,auVar16);
          auVar18 = vpmullw_avx2(auVar38,auVar39);
          auVar11 = vpmullw_avx2(auVar40,auVar6);
          auVar12 = vpmullw_avx2(auVar41,auVar13);
          auVar21 = vpmullw_avx2(auVar42,auVar15);
          auVar39 = vpaddd_avx2(auVar37,auVar16);
          auVar15 = vpand_avx2(auVar44,*(undefined1 (*) [32])
                                        (*(undefined1 (*) [32])((long)src + 0x20) + lVar26));
          auVar17 = vpmullw_avx2(auVar43,auVar17);
          auVar37 = vpmovsxwd_avx2(auVar25._16_16_);
          auVar6 = vpmovsxwd_avx2(auVar20._16_16_);
          auVar37 = vpaddd_avx2(auVar6,auVar37);
          auVar6 = vpmovzxwd_avx2(auVar15._0_16_);
          auVar16 = vpmullw_avx2(auVar6,auVar49);
          auVar6 = vpmovsxwd_avx2(auVar9._16_16_);
          auVar6 = vpaddd_avx2(auVar14,auVar6);
          auVar39 = vpaddd_avx2(auVar39,auVar6);
          auVar6 = vpmovsxwd_avx2(auVar18._0_16_);
          auVar13 = vpmovsxwd_avx2(auVar11._0_16_);
          auVar6 = vpaddd_avx2(auVar6,auVar13);
          auVar13 = vpmovsxwd_avx2(auVar12._0_16_);
          auVar13 = vpaddd_avx2(auVar16,auVar13);
          auVar14 = vpmovsxwd_avx2(auVar21._0_16_);
          auVar16 = vpmovsxwd_avx2(auVar17._0_16_);
          auVar14 = vpaddd_avx2(auVar16,auVar14);
          auVar19 = vpmullw_avx2(auVar45,auVar19);
          auVar20 = vpmullw_avx2(auVar46,auVar8);
          auVar6 = vpaddd_avx2(auVar14,auVar6);
          auVar14 = vpmovsxwd_avx2(auVar19._0_16_);
          auVar16 = vpmovsxwd_avx2(auVar20._0_16_);
          auVar14 = vpaddd_avx2(auVar16,auVar14);
          auVar8 = vpmullw_avx2(auVar47,auVar10);
          auVar16 = vpmovsxwd_avx2(auVar8._0_16_);
          auVar13 = vpaddd_avx2(auVar13,auVar16);
          auVar6 = vpaddd_avx2(auVar6,auVar13);
          auVar13 = vpmovsxwd_avx2(auVar18._16_16_);
          auVar16 = vpmovsxwd_avx2(auVar11._16_16_);
          auVar13 = vpaddd_avx2(auVar13,auVar16);
          auVar15 = vpmovzxwd_avx2(auVar15._16_16_);
          auVar16 = vpmullw_avx2(auVar15,auVar49);
          auVar18._8_4_ = 0x20;
          auVar18._0_8_ = 0x2000000020;
          auVar18._12_4_ = 0x20;
          auVar18._16_4_ = 0x20;
          auVar18._20_4_ = 0x20;
          auVar18._24_4_ = 0x20;
          auVar18._28_4_ = 0x20;
          auVar15 = vpmovsxwd_avx2(auVar12._16_16_);
          auVar15 = vpaddd_avx2(auVar15,auVar16);
          auVar16 = vpmovsxwd_avx2(auVar21._16_16_);
          auVar17 = vpmovsxwd_avx2(auVar17._16_16_);
          auVar16 = vpaddd_avx2(auVar17,auVar16);
          auVar13 = vpaddd_avx2(auVar13,auVar16);
          auVar16 = vpmovsxwd_avx2(auVar19._16_16_);
          auVar17 = vpmovsxwd_avx2(auVar20._16_16_);
          auVar16 = vpaddd_avx2(auVar17,auVar16);
          auVar17 = vpmovsxwd_avx2(auVar8._16_16_);
          auVar15 = vpaddd_avx2(auVar15,auVar17);
          auVar13 = vpaddd_avx2(auVar13,auVar15);
          auVar7 = vpaddd_avx2(auVar18,auVar7);
          auVar36 = vpaddd_avx2(auVar7,auVar36);
          auVar37 = vpaddd_avx2(auVar18,auVar37);
          auVar39 = vpaddd_avx2(auVar39,auVar37);
          auVar37 = vpaddd_avx2(auVar14,auVar18);
          auVar37 = vpaddd_avx2(auVar6,auVar37);
          auVar6 = vpaddd_avx2(auVar18,auVar16);
          auVar6 = vpaddd_avx2(auVar13,auVar6);
          auVar36 = vpsrad_avx2(auVar36,6);
          auVar39 = vpsrad_avx2(auVar39,6);
          auVar36 = vpackssdw_avx2(auVar36,auVar39);
          auVar39 = vpsrad_avx2(auVar37,6);
          auVar37 = vpsrad_avx2(auVar6,6);
          auVar39 = vpackssdw_avx2(auVar39,auVar37);
          auVar36 = vpermq_avx2(auVar36,0xd8);
          auVar36 = vpminsw_avx2(auVar48,auVar36);
          auVar36 = vpmaxsw_avx2(auVar36,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar39 = vpermq_avx2(auVar39,0xd8);
          auVar37._8_2_ = 0xff00;
          auVar37._0_8_ = 0xff00ff00ff00ff00;
          auVar37._10_2_ = 0xff00;
          auVar37._12_2_ = 0xff00;
          auVar37._14_2_ = 0xff00;
          auVar37._16_2_ = 0xff00;
          auVar37._18_2_ = 0xff00;
          auVar37._20_2_ = 0xff00;
          auVar37._22_2_ = 0xff00;
          auVar37._24_2_ = 0xff00;
          auVar37._26_2_ = 0xff00;
          auVar37._28_2_ = 0xff00;
          auVar37._30_2_ = 0xff00;
          auVar39 = vpminsw_avx2(auVar48,auVar39);
          auVar36 = vpblendvb_avx2(auVar36,*(undefined1 (*) [32])
                                            (*(undefined1 (*) [32])dst + lVar26),auVar37);
          auVar39 = vpmaxsw_avx2(auVar39,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar39 = vpblendvb_avx2(auVar39,*(undefined1 (*) [32])
                                            (*(undefined1 (*) [32])((long)dst + 0x20) + lVar26),
                                   auVar37);
          *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + lVar26) = auVar36;
          *(undefined1 (*) [32])(*(undefined1 (*) [32])((long)dst + 0x20) + lVar26) = auVar39;
          lVar26 = lVar26 + 0x40;
        } while (lVar26 < lcu_width * 2);
      }
      dst = *(undefined1 (*) [32])dst + i_dst;
      uVar34 = uVar34 + 1;
      src = (pel *)pauVar27;
    } while (uVar34 != lcu_height);
  }
  return;
}

Assistant:

void uavs3d_alf_one_lcu_one_chroma_avx2(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *imgPad1, *imgPad2, *imgPad3, *imgPad4, *imgPad5, *imgPad6;

    __m256i T00, T01, T10, T11, T20, T21, T30, T31, T40, T41, T50, T51, T60, T61, T70, T71, T80, T81;
    __m256i T8;
    __m256i T000, T001, T010, T011, T100, T101, T110, T111, T200, T201, T210, T211, T310, T311, T300, T301, T400, T401, T410, T411, T500, T501, T510, T511, T600, T601, T610, T611, T700, T701, T710, T711;
    __m256i E00, E01, E10, E11;
    __m256i C0, C1, C2, C3, C4, C5, C6, C7, C8;
    __m256i S0, S00, S01, S1, S10, S11, S2, S20, S21, S3, S30, S31, S4, S40, S41, S5, S50, S51, S6, S7, S60, S61, S70, S71, S80, S81, S82, S83, SS1, SS2, SS3, SS4;
    __m256i mAddOffset;
    __m256i mZero = _mm256_set1_epi16(0);
    __m256i mMax = _mm256_set1_epi16((short)((1 << sample_bit_depth) - 1));
    __m256i uv_mask = _mm256_set1_epi16(0xff);

    int i, j;
    int startPos = 0;
    int endPos = lcu_height;

    C0 = _mm256_set1_epi16(coef[0]);
    C1 = _mm256_set1_epi16(coef[2]);
    C2 = _mm256_set1_epi16(coef[4]);
    C3 = _mm256_set1_epi16(coef[6]);
    C4 = _mm256_set1_epi16(coef[8]);
    C5 = _mm256_set1_epi16(coef[10]);
    C6 = _mm256_set1_epi16(coef[12]);
    C7 = _mm256_set1_epi16(coef[14]);
    C8 = _mm256_set1_epi32(coef[16]);

    mAddOffset = _mm256_set1_epi32(32);

    for (i = startPos; i < endPos; i++) {
        imgPad1 = src + i_src;
        imgPad2 = src - i_src;
        imgPad3 = src + 2 * i_src;
        imgPad4 = src - 2 * i_src;
        imgPad5 = src + 3 * i_src;
        imgPad6 = src - 3 * i_src;
        if (i < 3) {
            if (i == 0) {
                imgPad4 = imgPad2 = src;
            }
            else if (i == 1) {
                imgPad4 = imgPad2;
            }
            imgPad6 = imgPad4;
        }
        else if (i > lcu_height - 4) {
            if (i == lcu_height - 1) {
                imgPad3 = imgPad1 = src;
            }
            else if (i == lcu_height - 2) {
                imgPad3 = imgPad1;
            }
            imgPad5 = imgPad3;
        }

        if (lcu_width <= 16) {
            T00 = _mm256_loadu_si256((__m256i*)&imgPad6[0]);
            T000 = _mm256_and_si256(T00, uv_mask);
            T00 = _mm256_loadu_si256((__m256i*)&imgPad5[0]);
            T010 = _mm256_and_si256(T00, uv_mask);
            E00 = _mm256_add_epi16(T000, T010);
            S00 = _mm256_mullo_epi16(C0, E00);//前16个像素所有C0*P0的结果

            T10 = _mm256_loadu_si256((__m256i*)&imgPad4[0]);
            T100 = _mm256_and_si256(T10, uv_mask);
            T11 = _mm256_loadu_si256((__m256i*)&imgPad3[0]);
            T110 = _mm256_and_si256(T11, uv_mask);
            E10 = _mm256_add_epi16(T100, T110);
            S10 = _mm256_mullo_epi16(C1, E10);//前16个像素所有C1*P1的结果


            T20 = _mm256_loadu_si256((__m256i*)&imgPad2[0 - 2]);
            T200 = _mm256_and_si256(T20, uv_mask);
            T30 = _mm256_loadu_si256((__m256i*)&imgPad2[0]);
            T300 = _mm256_and_si256(T30, uv_mask);
            T40 = _mm256_loadu_si256((__m256i*)&imgPad2[0 + 2]);
            T400 = _mm256_and_si256(T40, uv_mask);

            T41 = _mm256_loadu_si256((__m256i*)&imgPad1[0 - 2]);
            T410 = _mm256_and_si256(T41, uv_mask);
            T31 = _mm256_loadu_si256((__m256i*)&imgPad1[0]);
            T310 = _mm256_and_si256(T31, uv_mask);
            T21 = _mm256_loadu_si256((__m256i*)&imgPad1[0 + 2]);
            T210 = _mm256_and_si256(T21, uv_mask);

            T20 = _mm256_add_epi16(T200, T210);
            T30 = _mm256_add_epi16(T300, T310);
            T40 = _mm256_add_epi16(T400, T410);


            S20 = _mm256_mullo_epi16(T20, C2);
            S30 = _mm256_mullo_epi16(T30, C3);
            S40 = _mm256_mullo_epi16(T40, C4);

            T50 = _mm256_loadu_si256((__m256i*)&src[0 - 6]);
            T500 = _mm256_and_si256(T50, uv_mask);
            T60 = _mm256_loadu_si256((__m256i*)&src[0 - 4]);
            T600 = _mm256_and_si256(T60, uv_mask);
            T70 = _mm256_loadu_si256((__m256i*)&src[0 - 2]);
            T700 = _mm256_and_si256(T70, uv_mask);
            T8 = _mm256_loadu_si256((__m256i*)&src[0]);
            T80 = _mm256_and_si256(T8, uv_mask);
            T71 = _mm256_loadu_si256((__m256i*)&src[0 + 2]);
            T710 = _mm256_and_si256(T71, uv_mask);
            T61 = _mm256_loadu_si256((__m256i*)&src[0 + 4]);
            T610 = _mm256_and_si256(T61, uv_mask);
            T51 = _mm256_loadu_si256((__m256i*)&src[0 + 6]);
            T510 = _mm256_and_si256(T51, uv_mask);

            T50 = _mm256_add_epi16(T500, T510);
            T60 = _mm256_add_epi16(T600, T610);
            T70 = _mm256_add_epi16(T700, T710);

            S50 = _mm256_mullo_epi16(T50, C5);
            S60 = _mm256_mullo_epi16(T60, C6);
            S70 = _mm256_mullo_epi16(T70, C7);

            S80 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(T80));
            S81 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(T80, 1));
            S80 = _mm256_mullo_epi16(S80, C8);
            S81 = _mm256_mullo_epi16(S81, C8);

            S0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S00));
            S1 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S10));
            S2 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S20));
            S3 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S30));
            S4 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S40));
            S5 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S50));
            S6 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S60));
            S7 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S70));
            S0 = _mm256_add_epi32(S0, S1);
            S2 = _mm256_add_epi32(S2, S3);
            S4 = _mm256_add_epi32(S4, S5);
            S6 = _mm256_add_epi32(S6, S7);
            S0 = _mm256_add_epi32(S0, S2);
            S4 = _mm256_add_epi32(S4, S6);
            SS1 = _mm256_add_epi32(S0, S4);
            SS1 = _mm256_add_epi32(SS1, S80);    //0-7

            S0 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S00, 1));
            S1 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S10, 1));
            S2 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S20, 1));
            S3 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S30, 1));
            S4 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S40, 1));
            S5 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S50, 1));
            S6 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S60, 1));
            S7 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S70, 1));
            //S8 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S80, 1));
            S0 = _mm256_add_epi32(S0, S1);
            S2 = _mm256_add_epi32(S2, S3);
            S4 = _mm256_add_epi32(S4, S5);
            S6 = _mm256_add_epi32(S6, S7);
            S0 = _mm256_add_epi32(S0, S2);
            S4 = _mm256_add_epi32(S4, S6);
            SS2 = _mm256_add_epi32(S0, S4);
            SS2 = _mm256_add_epi32(SS2, S81);    //8-15

            SS1 = _mm256_add_epi32(SS1, mAddOffset);
            SS2 = _mm256_add_epi32(SS2, mAddOffset);

            SS1 = _mm256_srai_epi32(SS1, 6);
            SS2 = _mm256_srai_epi32(SS2, 6);

            SS1 = _mm256_packs_epi32(SS1, SS2);
            SS1 = _mm256_permute4x64_epi64(SS1, 0xd8);

            T00 = _mm256_loadu_si256((__m256i*)&dst[0]);

            SS1 = _mm256_min_epi16(SS1, mMax);
            SS1 = _mm256_max_epi16(SS1, mZero);

            T00 = _mm256_blendv_epi8(T00, SS1, uv_mask);
            _mm256_storeu_si256((__m256i*)(dst), T00);
        }
        else {
            for (j = 0; j < lcu_width << 1; j += 64) {
                T00 = _mm256_loadu_si256((__m256i*)&imgPad6[j]);
                T01 = _mm256_loadu_si256((__m256i*)&imgPad6[j + 32]);
                T000 = _mm256_and_si256(T00, uv_mask);
                T001 = _mm256_and_si256(T01, uv_mask);
                T00 = _mm256_loadu_si256((__m256i*)&imgPad5[j]);
                T01 = _mm256_loadu_si256((__m256i*)&imgPad5[j + 32]);
                T010 = _mm256_and_si256(T00, uv_mask);
                T011 = _mm256_and_si256(T01, uv_mask);
                E00 = _mm256_add_epi16(T000, T010);
                E01 = _mm256_add_epi16(T001, T011);
                S00 = _mm256_mullo_epi16(C0, E00);//前16个像素所有C0*P0的结果
                S01 = _mm256_mullo_epi16(C0, E01);//后16个像素所有C0*P0的结果

                T10 = _mm256_loadu_si256((__m256i*)&imgPad4[j]);
                T11 = _mm256_loadu_si256((__m256i*)&imgPad4[j + 32]);
                T100 = _mm256_and_si256(T10, uv_mask);
                T101 = _mm256_and_si256(T11, uv_mask);
                T11 = _mm256_loadu_si256((__m256i*)&imgPad3[j]);
                T00 = _mm256_loadu_si256((__m256i*)&imgPad3[j + 32]);
                T110 = _mm256_and_si256(T11, uv_mask);
                T111 = _mm256_and_si256(T00, uv_mask);
                E10 = _mm256_add_epi16(T100, T110);
                E11 = _mm256_add_epi16(T101, T111);
                S10 = _mm256_mullo_epi16(C1, E10);//前16个像素所有C1*P1的结果
                S11 = _mm256_mullo_epi16(C1, E11);//后16个像素所有C1*P1的结果


                T20 = _mm256_loadu_si256((__m256i*)&imgPad2[j - 2]);
                T30 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 30]);
                T200 = _mm256_and_si256(T20, uv_mask);
                T201 = _mm256_and_si256(T30, uv_mask);
                T30 = _mm256_loadu_si256((__m256i*)&imgPad2[j]);
                T40 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 32]);
                T300 = _mm256_and_si256(T30, uv_mask);
                T301 = _mm256_and_si256(T40, uv_mask);
                T40 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 2]);
                T41 = _mm256_loadu_si256((__m256i*)&imgPad2[j + 34]);
                T400 = _mm256_and_si256(T40, uv_mask);
                T401 = _mm256_and_si256(T41, uv_mask);

                T41 = _mm256_loadu_si256((__m256i*)&imgPad1[j - 2]);
                T40 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 30]);
                T410 = _mm256_and_si256(T41, uv_mask);
                T411 = _mm256_and_si256(T40, uv_mask);
                T31 = _mm256_loadu_si256((__m256i*)&imgPad1[j]);
                T00 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 32]);
                T310 = _mm256_and_si256(T31, uv_mask);
                T311 = _mm256_and_si256(T00, uv_mask);
                T21 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 2]);
                T01 = _mm256_loadu_si256((__m256i*)&imgPad1[j + 34]);
                T210 = _mm256_and_si256(T21, uv_mask);
                T211 = _mm256_and_si256(T01, uv_mask);

                T20 = _mm256_add_epi16(T200, T210); // 前16个数
                T21 = _mm256_add_epi16(T201, T211); //后16个数
                T30 = _mm256_add_epi16(T300, T310);
                T31 = _mm256_add_epi16(T301, T311);
                T40 = _mm256_add_epi16(T400, T410);
                T41 = _mm256_add_epi16(T401, T411);


                S20 = _mm256_mullo_epi16(T20, C2);
                S21 = _mm256_mullo_epi16(T21, C2);
                S30 = _mm256_mullo_epi16(T30, C3);
                S31 = _mm256_mullo_epi16(T31, C3);
                S40 = _mm256_mullo_epi16(T40, C4);
                S41 = _mm256_mullo_epi16(T41, C4);

                T50 = _mm256_loadu_si256((__m256i*)&src[j - 6]);
                T00 = _mm256_loadu_si256((__m256i*)&src[j + 26]);
                T500 = _mm256_and_si256(T50, uv_mask);
                T501 = _mm256_and_si256(T00, uv_mask);
                T60 = _mm256_loadu_si256((__m256i*)&src[j - 4]);
                T20 = _mm256_loadu_si256((__m256i*)&src[j + 28]);
                T600 = _mm256_and_si256(T60, uv_mask);
                T601 = _mm256_and_si256(T20, uv_mask);
                T70 = _mm256_loadu_si256((__m256i*)&src[j - 2]);
                T30 = _mm256_loadu_si256((__m256i*)&src[j + 30]);
                T700 = _mm256_and_si256(T70, uv_mask);
                T701 = _mm256_and_si256(T30, uv_mask);
                T8 = _mm256_loadu_si256((__m256i*)&src[j]);
                T01 = _mm256_loadu_si256((__m256i*)&src[j + 32]);
                T80 = _mm256_and_si256(T8, uv_mask);
                T81 = _mm256_and_si256(T01, uv_mask);
                T71 = _mm256_loadu_si256((__m256i*)&src[j + 2]);
                T11 = _mm256_loadu_si256((__m256i*)&src[j + 34]);
                T710 = _mm256_and_si256(T71, uv_mask);
                T711 = _mm256_and_si256(T11, uv_mask);
                T61 = _mm256_loadu_si256((__m256i*)&src[j + 4]);
                T21 = _mm256_loadu_si256((__m256i*)&src[j + 36]);
                T610 = _mm256_and_si256(T61, uv_mask);
                T611 = _mm256_and_si256(T21, uv_mask);
                T51 = _mm256_loadu_si256((__m256i*)&src[j + 6]);
                T31 = _mm256_loadu_si256((__m256i*)&src[j + 38]);
                T510 = _mm256_and_si256(T51, uv_mask);
                T511 = _mm256_and_si256(T31, uv_mask);

                T50 = _mm256_add_epi16(T500, T510);
                T51 = _mm256_add_epi16(T501, T511);
                T60 = _mm256_add_epi16(T600, T610);
                T61 = _mm256_add_epi16(T601, T611);
                T70 = _mm256_add_epi16(T700, T710);
                T71 = _mm256_add_epi16(T701, T711);

                S50 = _mm256_mullo_epi16(T50, C5);
                S51 = _mm256_mullo_epi16(T51, C5);
                S60 = _mm256_mullo_epi16(T60, C6);
                S61 = _mm256_mullo_epi16(T61, C6);
                S70 = _mm256_mullo_epi16(T70, C7);
                S71 = _mm256_mullo_epi16(T71, C7);

                S80 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(T80));
                S81 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(T80, 1));
                S82 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(T81));
                S83 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(T81, 1));
                S80 = _mm256_mullo_epi16(S80, C8);
                S81 = _mm256_mullo_epi16(S81, C8);
                S82 = _mm256_mullo_epi16(S82, C8);
                S83 = _mm256_mullo_epi16(S83, C8);

                S0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S00));
                S1 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S10));
                S2 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S20));
                S3 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S30));
                S4 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S40));
                S5 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S50));
                S6 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S60));
                S7 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S70));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS1 = _mm256_add_epi32(S0, S4);
                SS1 = _mm256_add_epi32(SS1, S80);    //0-7

                S0 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S00, 1));
                S1 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S10, 1));
                S2 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S20, 1));
                S3 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S30, 1));
                S4 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S40, 1));
                S5 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S50, 1));
                S6 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S60, 1));
                S7 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S70, 1));
                //S8 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S80, 1));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS2 = _mm256_add_epi32(S0, S4);
                SS2 = _mm256_add_epi32(SS2, S81);    //8-15

                S0 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S01));
                S1 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S11));
                S2 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S21));
                S3 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S31));
                S4 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S41));
                S5 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S51));
                S6 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S61));
                S7 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S71));
                //S8 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(S81));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS3 = _mm256_add_epi32(S0, S4);
                SS3 = _mm256_add_epi32(SS3, S82);    //16-23

                S0 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S01, 1));
                S1 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S11, 1));
                S2 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S21, 1));
                S3 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S31, 1));
                S4 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S41, 1));
                S5 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S51, 1));
                S6 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S61, 1));
                S7 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S71, 1));
                //S8 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(S81, 1));
                S0 = _mm256_add_epi32(S0, S1);
                S2 = _mm256_add_epi32(S2, S3);
                S4 = _mm256_add_epi32(S4, S5);
                S6 = _mm256_add_epi32(S6, S7);
                S0 = _mm256_add_epi32(S0, S2);
                S4 = _mm256_add_epi32(S4, S6);
                SS4 = _mm256_add_epi32(S0, S4);
                SS4 = _mm256_add_epi32(SS4, S83);    //24-31

                SS1 = _mm256_add_epi32(SS1, mAddOffset);
                SS2 = _mm256_add_epi32(SS2, mAddOffset);
                SS3 = _mm256_add_epi32(SS3, mAddOffset);
                SS4 = _mm256_add_epi32(SS4, mAddOffset);

                SS1 = _mm256_srai_epi32(SS1, 6);
                SS2 = _mm256_srai_epi32(SS2, 6);
                SS3 = _mm256_srai_epi32(SS3, 6);
                SS4 = _mm256_srai_epi32(SS4, 6);

                SS1 = _mm256_packs_epi32(SS1, SS2);
                SS3 = _mm256_packs_epi32(SS3, SS4);
                SS1 = _mm256_permute4x64_epi64(SS1, 0xd8);
                SS3 = _mm256_permute4x64_epi64(SS3, 0xd8);

                T00 = _mm256_loadu_si256((__m256i*)&dst[j]);
                T01 = _mm256_loadu_si256((__m256i*)&dst[j + 32]);

                SS1 = _mm256_min_epi16(SS1, mMax);
                SS1 = _mm256_max_epi16(SS1, mZero);
                SS3 = _mm256_min_epi16(SS3, mMax);
                SS3 = _mm256_max_epi16(SS3, mZero);

                T00 = _mm256_blendv_epi8(T00, SS1, uv_mask);
                T01 = _mm256_blendv_epi8(T01, SS3, uv_mask);
                _mm256_storeu_si256((__m256i*)(dst + j), T00);
                _mm256_storeu_si256((__m256i*)(dst + j + 32), T01);
            }
        }
        src += i_src;
        dst += i_dst;
    }
}